

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

string * pbrt::(anonymous_namespace)::TimeNow_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  stringstream ss;
  tm tm;
  time_t t;
  stringstream local_1d0 [144];
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffec0;
  _Put_time<char> in_stack_fffffffffffffec8;
  tm local_48;
  time_t local_10 [2];
  
  local_10[0] = ::time((time_t *)0x0);
  ptVar1 = localtime(local_10);
  local_48.tm_sec = ptVar1->tm_sec;
  local_48.tm_min = ptVar1->tm_min;
  local_48.tm_hour = ptVar1->tm_hour;
  local_48.tm_mday = ptVar1->tm_mday;
  local_48.tm_mon = ptVar1->tm_mon;
  local_48.tm_year = ptVar1->tm_year;
  local_48.tm_wday = ptVar1->tm_wday;
  local_48.tm_yday = ptVar1->tm_yday;
  local_48.tm_isdst = ptVar1->tm_isdst;
  local_48._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_48.tm_gmtoff = ptVar1->tm_gmtoff;
  local_48.tm_zone = ptVar1->tm_zone;
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::put_time<char>(&local_48,"%Y%m%d.%H%M%S");
  std::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return in_RDI;
}

Assistant:

std::string TimeNow() {
    std::time_t t = std::time(NULL);
    std::tm tm = *std::localtime(&t);
    std::stringstream ss;
    ss << std::put_time(&tm, "%Y%m%d.%H%M%S");
    return ss.str();
}